

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall
wasm::TranslateToFuzzReader::makeArraySet(TranslateToFuzzReader *this,Type type)

{
  undefined1 type_00 [8];
  bool bVar1;
  value_type *pvVar2;
  Expression *pEVar3;
  Expression *ref;
  Expression *value;
  ArraySet *pAVar4;
  If *pIVar5;
  Builder *builder;
  Builder *pBVar6;
  optional<wasm::Type> type_01;
  undefined1 local_60 [8];
  BoundsCheck check;
  value_type arrayType;
  
  if (type.id != 0) {
    __assert_fail("type == Type::none",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x13bf,"Expression *wasm::TranslateToFuzzReader::makeArraySet(Type)");
  }
  if ((this->mutableArrays).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->mutableArrays).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pvVar2 = Random::pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                       (&this->random,&this->mutableArrays);
    check.getLength = (Expression *)pvVar2->id;
    ::wasm::HeapType::getArray();
    type_00 = local_60;
    pEVar3 = make(this,(Type)0x2);
    ref = makeTrappingRefUse(this,(HeapType)check.getLength);
    value = make(this,(Type)type_00);
    if ((this->allowOOB == true) && (bVar1 = Random::oneIn(&this->random,10), bVar1)) {
      pAVar4 = Builder::makeArraySet(&this->builder,ref,pEVar3,value);
      return (Expression *)pAVar4;
    }
    builder = &this->builder;
    pBVar6 = builder;
    makeArrayBoundsCheck
              ((BoundsCheck *)local_60,ref,pEVar3,this->funcContext->func,builder,(Expression *)0x0)
    ;
    pAVar4 = Builder::makeArraySet(builder,check.condition,check.getRef,value);
    type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pBVar6;
    pIVar5 = Builder::makeIf(builder,(Expression *)local_60,(Expression *)pAVar4,(Expression *)0x0,
                             type_01);
    return (Expression *)pIVar5;
  }
  pEVar3 = makeTrivial(this,(Type)0x0);
  return pEVar3;
}

Assistant:

Expression* TranslateToFuzzReader::makeArraySet(Type type) {
  assert(type == Type::none);
  if (mutableArrays.empty()) {
    return makeTrivial(type);
  }
  auto arrayType = pick(mutableArrays);
  auto elementType = arrayType.getArray().element.type;
  auto* index = make(Type::i32);
  auto* ref = makeTrappingRefUse(arrayType);
  auto* value = make(elementType);
  // Only rarely emit a plain get which might trap. See related logic in
  // ::makePointer().
  if (allowOOB && oneIn(10)) {
    return builder.makeArraySet(ref, index, value);
  }
  // To avoid a trap, check the length dynamically using this pattern:
  //
  //   if (index < array.len) array[index] = value;
  //
  auto check = makeArrayBoundsCheck(ref, index, funcContext->func, builder);
  auto* set = builder.makeArraySet(check.getRef, check.getIndex, value);
  return builder.makeIf(check.condition, set);
}